

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&> * __thiscall
Catch::ExprLhs<trng::matrix<trng::GF2,4ul>const&>::operator==
          (ExprLhs<const_trng::matrix<trng::GF2,_4UL>_&> *this,matrix<trng::GF2,_4UL> *rhs)

{
  StringRef op;
  bool comparisonResult;
  matrix<trng::GF2,_4UL> *in_RSI;
  BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&> *in_RDI;
  matrix<trng::GF2,_4UL> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  pointer pGVar1;
  BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<trng::matrix<trng::GF2,4ul>,trng::matrix<trng::GF2,4ul>>
                 (in_RSI,in_stack_ffffffffffffffa8);
  pGVar1 = (in_RSI->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)pGVar1;
  BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }